

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

void __thiscall
t_cpp_generator::generate_enum_constant_list
          (t_cpp_generator *this,ostream *f,
          vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *constants,char *prefix,
          char *suffix,bool include_values)

{
  int *piVar1;
  bool bVar2;
  ostream *poVar3;
  pointer pptVar4;
  
  poVar3 = std::operator<<(f," {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  bVar2 = true;
  for (pptVar4 = (constants->super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar4 !=
      (constants->super__Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>)._M_impl.
      super__Vector_impl_data._M_finish; pptVar4 = pptVar4 + 1) {
    if (!bVar2) {
      poVar3 = std::operator<<(f,",");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    }
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x22])(this,f,*pptVar4);
    poVar3 = t_generator::indent((t_generator *)this,f);
    poVar3 = std::operator<<(poVar3,prefix);
    poVar3 = std::operator<<(poVar3,(string *)&(*pptVar4)->name_);
    std::operator<<(poVar3,suffix);
    if (include_values) {
      poVar3 = std::operator<<(f," = ");
      std::ostream::operator<<(poVar3,(*pptVar4)->value_);
    }
    bVar2 = false;
  }
  std::operator<<(f,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar3 = t_generator::indent((t_generator *)this,f);
  poVar3 = std::operator<<(poVar3,"};");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_cpp_generator::generate_enum_constant_list(std::ostream& f,
                                                  const vector<t_enum_value*>& constants,
                                                  const char* prefix,
                                                  const char* suffix,
                                                  bool include_values) {
  f << " {" << endl;
  indent_up();

  vector<t_enum_value*>::const_iterator c_iter;
  bool first = true;
  for (c_iter = constants.begin(); c_iter != constants.end(); ++c_iter) {
    if (first) {
      first = false;
    } else {
      f << "," << endl;
    }
    generate_java_doc(f, *c_iter);
    indent(f) << prefix << (*c_iter)->get_name() << suffix;
    if (include_values) {
      f << " = " << (*c_iter)->get_value();
    }
  }

  f << endl;
  indent_down();
  indent(f) << "};" << endl;
}